

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O1

void advance_eg_channel(FM_OPN *OPN,FM_SLOT *SLOT)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  INT32 *pIVar5;
  FM_SLOT *pFVar6;
  long lVar7;
  
  lVar7 = 0;
  pFVar6 = SLOT;
  do {
    switch((&SLOT->state)[lVar7]) {
    case '\x01':
      bVar1 = (&SLOT->eg_sh_rr)[lVar7];
      uVar4 = OPN->eg_cnt;
      if ((uVar4 & ~(-1 << (bVar1 & 0x1f))) == 0) {
        if (((&SLOT->ssg)[lVar7] & 8) == 0) {
          iVar2 = (uint)""[(ulong)(uVar4 >> (bVar1 & 0x1f) & 7) + (ulong)(&SLOT->eg_sel_rr)[lVar7]]
                  + *(int *)((long)&SLOT->volume + lVar7);
          *(int *)((long)&SLOT->volume + lVar7) = iVar2;
          if (0x3fe < iVar2) {
            pIVar5 = &pFVar6->volume;
LAB_00171b61:
            *pIVar5 = 0x3ff;
            (&SLOT->state)[lVar7] = '\0';
          }
        }
        else {
          iVar2 = *(int *)((long)&SLOT->volume + lVar7);
          if (iVar2 < 0x200) {
            *(uint *)((long)&SLOT->volume + lVar7) =
                 iVar2 + (uint)""[(ulong)(uVar4 >> (bVar1 & 0x1f) & 7) +
                                  (ulong)(&SLOT->eg_sel_rr)[lVar7]] * 4;
          }
          if (0x1ff < *(int *)((long)&SLOT->volume + lVar7)) {
            pIVar5 = (INT32 *)((long)&SLOT->volume + lVar7);
            goto LAB_00171b61;
          }
        }
LAB_00171b6d:
        iVar2 = *(int *)((long)&SLOT->tl + lVar7) + *(int *)((long)&SLOT->volume + lVar7);
LAB_00171b77:
        *(int *)((long)&SLOT->vol_out + lVar7) = iVar2;
      }
      break;
    case '\x02':
      bVar1 = (&SLOT->eg_sh_d2r)[lVar7];
      uVar4 = OPN->eg_cnt;
      if ((uVar4 & ~(-1 << (bVar1 & 0x1f))) == 0) {
        if (((&SLOT->ssg)[lVar7] & 8) == 0) {
          uVar4 = (uint)""[(ulong)(uVar4 >> (bVar1 & 0x1f) & 7) + (ulong)(&SLOT->eg_sel_d2r)[lVar7]]
                  + *(int *)((long)&SLOT->volume + lVar7);
          if (0x3fe < (int)uVar4) {
            uVar4 = 0x3ff;
          }
          *(uint *)((long)&SLOT->volume + lVar7) = uVar4;
LAB_00171aba:
          iVar2 = uVar4 + *(int *)((long)&SLOT->tl + lVar7);
          goto LAB_00171b77;
        }
        iVar2 = *(int *)((long)&SLOT->volume + lVar7);
        if (iVar2 < 0x200) {
          uVar4 = iVar2 + (uint)""[(ulong)(uVar4 >> (bVar1 & 0x1f) & 7) +
                                   (ulong)(&SLOT->eg_sel_d2r)[lVar7]] * 4;
          *(uint *)((long)&SLOT->volume + lVar7) = uVar4;
          if ((&SLOT->ssgn)[lVar7] == ((&SLOT->ssg)[lVar7] & 4)) goto LAB_00171aba;
          *(uint *)((long)&SLOT->vol_out + lVar7) =
               (0x200 - uVar4 & 0x3ff) + *(int *)((long)&SLOT->tl + lVar7);
        }
      }
      break;
    case '\x03':
      bVar1 = (&SLOT->eg_sh_d1r)[lVar7];
      uVar4 = OPN->eg_cnt;
      if ((uVar4 & ~(-1 << (bVar1 & 0x1f))) == 0) {
        if (((&SLOT->ssg)[lVar7] & 8) == 0) {
          uVar4 = (uint)""[(ulong)(uVar4 >> (bVar1 & 0x1f) & 7) + (ulong)(&SLOT->eg_sel_d1r)[lVar7]]
                  + *(int *)((long)&SLOT->volume + lVar7);
          *(uint *)((long)&SLOT->volume + lVar7) = uVar4;
LAB_001719bd:
          *(uint *)((long)&SLOT->vol_out + lVar7) = uVar4 + *(int *)((long)&SLOT->tl + lVar7);
        }
        else {
          iVar2 = *(int *)((long)&SLOT->volume + lVar7);
          if (iVar2 < 0x200) {
            uVar4 = iVar2 + (uint)""[(ulong)(uVar4 >> (bVar1 & 0x1f) & 7) +
                                     (ulong)(&SLOT->eg_sel_d1r)[lVar7]] * 4;
            *(uint *)((long)&SLOT->volume + lVar7) = uVar4;
            if ((&SLOT->ssgn)[lVar7] != ((&SLOT->ssg)[lVar7] & 4)) {
              uVar4 = 0x200 - uVar4 & 0x3ff;
            }
            goto LAB_001719bd;
          }
        }
        if (*(int *)((long)&SLOT->sl + lVar7) <= *(int *)((long)&SLOT->volume + lVar7)) {
          (&SLOT->state)[lVar7] = '\x02';
        }
      }
      break;
    case '\x04':
      if ((OPN->eg_cnt & ~(-1 << ((&SLOT->eg_sh_ar)[lVar7] & 0x1f))) == 0) {
        uVar4 = *(uint *)((long)&SLOT->volume + lVar7);
        iVar2 = (int)((uint)""[(ulong)(OPN->eg_cnt >> ((&SLOT->eg_sh_ar)[lVar7] & 0x1f) & 7) +
                               (ulong)(&SLOT->eg_sel_ar)[lVar7]] * ~uVar4) >> 4;
        iVar3 = iVar2 + uVar4;
        *(int *)((long)&SLOT->volume + lVar7) = iVar3;
        if (iVar3 == 0 || SCARRY4(iVar2,uVar4) != iVar3 < 0) {
          *(undefined4 *)((long)&SLOT->volume + lVar7) = 0;
          (&SLOT->state)[lVar7] = *(int *)((long)&SLOT->sl + lVar7) == 0 ^ 3;
        }
        if ((((&SLOT->ssg)[lVar7] & 8) == 0) || (((&SLOT->ssg)[lVar7] & 4) == (&SLOT->ssgn)[lVar7]))
        goto LAB_00171b6d;
        uVar4 = 0x200U - *(int *)((long)&SLOT->volume + lVar7) & 0x3ff;
        goto LAB_00171aba;
      }
    }
    pFVar6 = pFVar6 + 1;
    lVar7 = lVar7 + 0x50;
    if ((int)lVar7 == 0x140) {
      return;
    }
  } while( true );
}

Assistant:

INLINE void advance_eg_channel(FM_OPN *OPN, FM_SLOT *SLOT)
{
	/* unsigned int out; */
	unsigned int i = 4; /* four operators per channel */

	do
	{
		switch(SLOT->state)
		{
			case EG_ATT:    /* attack phase */
			if (!(OPN->eg_cnt & ((1<<SLOT->eg_sh_ar)-1)))
			{
				/* update attenuation level */
				SLOT->volume += (~SLOT->volume * (eg_inc[SLOT->eg_sel_ar + ((OPN->eg_cnt>>SLOT->eg_sh_ar)&7)]))>>4;

				/* check phase transition*/
				if (SLOT->volume <= MIN_ATT_INDEX)
				{
					SLOT->volume = MIN_ATT_INDEX;
					SLOT->state = (SLOT->sl == MIN_ATT_INDEX) ? EG_SUS : EG_DEC; /* special case where SL=0 */
				}

				/* recalculate EG output */
				if ((SLOT->ssg&0x08) && (SLOT->ssgn ^ (SLOT->ssg&0x04)))  /* SSG-EG Output Inversion */
				SLOT->vol_out = ((UINT32)(0x200 - SLOT->volume) & MAX_ATT_INDEX) + SLOT->tl;
				else
					SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
			}
			break;

			case EG_DEC:  /* decay phase */
			if (!(OPN->eg_cnt & ((1<<SLOT->eg_sh_d1r)-1)))
			{
				/* SSG EG type */
				if (SLOT->ssg&0x08)
				{
					/* update attenuation level */
					if (SLOT->volume < 0x200)
				{
					SLOT->volume += 4 * eg_inc[SLOT->eg_sel_d1r + ((OPN->eg_cnt>>SLOT->eg_sh_d1r)&7)];

					/* recalculate EG output */
					if (SLOT->ssgn ^ (SLOT->ssg&0x04))   /* SSG-EG Output Inversion */
						SLOT->vol_out = ((UINT32)(0x200 - SLOT->volume) & MAX_ATT_INDEX) + SLOT->tl;
					else
						SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
				}

				}
				else
				{
				/* update attenuation level */
				SLOT->volume += eg_inc[SLOT->eg_sel_d1r + ((OPN->eg_cnt>>SLOT->eg_sh_d1r)&7)];

				/* recalculate EG output */
				SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
				}

				/* check phase transition*/
				if (SLOT->volume >= (INT32)(SLOT->sl))
					SLOT->state = EG_SUS;
			}
			break;

			case EG_SUS:  /* sustain phase */
			if (!(OPN->eg_cnt & ((1<<SLOT->eg_sh_d2r)-1)))
			{
				/* SSG EG type */
				if (SLOT->ssg&0x08)
				{
				/* update attenuation level */
				if (SLOT->volume < 0x200)
				{
					SLOT->volume += 4 * eg_inc[SLOT->eg_sel_d2r + ((OPN->eg_cnt>>SLOT->eg_sh_d2r)&7)];

					/* recalculate EG output */
					if (SLOT->ssgn ^ (SLOT->ssg&0x04))   /* SSG-EG Output Inversion */
						SLOT->vol_out = ((UINT32)(0x200 - SLOT->volume) & MAX_ATT_INDEX) + SLOT->tl;
					else
						SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
				}
				}
				else
				{
					/* update attenuation level */
					SLOT->volume += eg_inc[SLOT->eg_sel_d2r + ((OPN->eg_cnt>>SLOT->eg_sh_d2r)&7)];

					/* check phase transition*/
					if ( SLOT->volume >= MAX_ATT_INDEX )
						SLOT->volume = MAX_ATT_INDEX;
					/* do not change SLOT->state (verified on real chip) */

					/* recalculate EG output */
					SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
				}
			}
			break;

			case EG_REL:  /* release phase */
			if (!(OPN->eg_cnt & ((1<<SLOT->eg_sh_rr)-1)))
			{
				/* SSG EG type */
				if (SLOT->ssg&0x08)
				{
					/* update attenuation level */
					if (SLOT->volume < 0x200)
						SLOT->volume += 4 * eg_inc[SLOT->eg_sel_rr + ((OPN->eg_cnt>>SLOT->eg_sh_rr)&7)];
				/* check phase transition */
				if (SLOT->volume >= 0x200)
				{
					SLOT->volume = MAX_ATT_INDEX;
					SLOT->state = EG_OFF;
				}
				}
				else
				{
					/* update attenuation level */
					SLOT->volume += eg_inc[SLOT->eg_sel_rr + ((OPN->eg_cnt>>SLOT->eg_sh_rr)&7)];

					/* check phase transition*/
					if (SLOT->volume >= MAX_ATT_INDEX)
					{
						SLOT->volume = MAX_ATT_INDEX;
						SLOT->state = EG_OFF;
					}
				}

				/* recalculate EG output */
				SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;

			}
			break;
		}

		/* Valley Bell: These few lines are missing in Genesis Plus GX' ym2612 core file.
			Disabling them fixes the SSG-EG.
			Additional Note: Asterix and the Great Rescue: Level 1 sounds "better" with these lines,
			but less accurate. */
		#if 0
		out = ((UINT32)SLOT->volume);

		/* negate output (changes come from alternate bit, init comes from attack bit) */
		if ((SLOT->ssg&0x08) && (SLOT->ssgn&2) && (SLOT->state > EG_REL))
			out ^= MAX_ATT_INDEX;

		/* we need to store the result here because we are going to change ssgn
			in next instruction */
		SLOT->vol_out = out + SLOT->tl;
		#endif

		SLOT++;
		i--;
	} while (i);

}